

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O1

void Edg_ManToMapping(Gia_Man_t *p)

{
  uint Entry;
  void *pvVar1;
  int *piVar2;
  int iVar3;
  Vec_Wec_t *pVVar4;
  Vec_Int_t *pVVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  size_t __size;
  long lVar11;
  long lVar12;
  
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                  ,0x294,"void Edg_ManToMapping(Gia_Man_t *)");
  }
  pVVar4 = p->vMapping2;
  if (pVVar4 != (Vec_Wec_t *)0x0) {
    if (0 < pVVar4->nCap) {
      lVar8 = 8;
      lVar12 = 0;
      do {
        pvVar1 = *(void **)((long)&pVVar4->pArray->nCap + lVar8);
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
          *(undefined8 *)((long)&pVVar4->pArray->nCap + lVar8) = 0;
        }
        lVar12 = lVar12 + 1;
        lVar8 = lVar8 + 0x10;
      } while (lVar12 < pVVar4->nCap);
    }
    if (pVVar4->pArray != (Vec_Int_t *)0x0) {
      free(pVVar4->pArray);
      pVVar4->pArray = (Vec_Int_t *)0x0;
    }
    pVVar4->nCap = 0;
    pVVar4->nSize = 0;
    free(pVVar4);
    p->vMapping2 = (Vec_Wec_t *)0x0;
  }
  pVVar4 = p->vFanouts2;
  if (pVVar4 != (Vec_Wec_t *)0x0) {
    if (0 < pVVar4->nCap) {
      lVar8 = 8;
      lVar12 = 0;
      do {
        pvVar1 = *(void **)((long)&pVVar4->pArray->nCap + lVar8);
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
          *(undefined8 *)((long)&pVVar4->pArray->nCap + lVar8) = 0;
        }
        lVar12 = lVar12 + 1;
        lVar8 = lVar8 + 0x10;
      } while (lVar12 < pVVar4->nCap);
    }
    if (pVVar4->pArray != (Vec_Int_t *)0x0) {
      free(pVVar4->pArray);
      pVVar4->pArray = (Vec_Int_t *)0x0;
    }
    pVVar4->nCap = 0;
    pVVar4->nSize = 0;
    free(pVVar4);
    p->vFanouts2 = (Vec_Wec_t *)0x0;
  }
  iVar3 = p->nObjs;
  pVVar4 = (Vec_Wec_t *)malloc(0x10);
  iVar10 = 8;
  if (6 < iVar3 - 1U) {
    iVar10 = iVar3;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar10;
  if (iVar10 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)iVar10,0x10);
  }
  pVVar4->pArray = pVVar5;
  pVVar4->nSize = iVar3;
  p->vMapping2 = pVVar4;
  pVVar4 = (Vec_Wec_t *)malloc(0x10);
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar10;
  if (iVar10 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)iVar10,0x10);
  }
  pVVar4->pArray = pVVar5;
  pVVar4->nSize = iVar3;
  p->vFanouts2 = pVVar4;
  if (1 < p->nObjs) {
    lVar8 = 1;
    do {
      iVar3 = p->vMapping->nSize;
      if (iVar3 <= lVar8) goto LAB_001f9ac3;
      piVar2 = p->vMapping->pArray;
      uVar6 = piVar2[lVar8];
      if ((ulong)uVar6 != 0) {
        if (((int)uVar6 < 0) || (iVar3 <= (int)uVar6)) {
LAB_001f9ac3:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (4 < piVar2[uVar6]) {
          __assert_fail("Gia_ObjLutSize(p, iObj) <= 4",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                        ,0x29b,"void Edg_ManToMapping(Gia_Man_t *)");
        }
        pVVar5 = p->vMapping;
        lVar12 = (long)pVVar5->nSize;
        if (lVar12 <= lVar8) goto LAB_001f9ac3;
        uVar6 = (int)lVar8 + 1;
        lVar11 = 0;
        while( true ) {
          piVar2 = pVVar5->pArray;
          lVar7 = (long)piVar2[lVar8];
          if ((lVar7 < 0) || ((int)lVar12 <= piVar2[lVar8])) goto LAB_001f9ac3;
          if (piVar2[lVar7] <= lVar11) break;
          Entry = piVar2[lVar7 + lVar11 + 1];
          pVVar4 = p->vMapping2;
          if (pVVar4->nSize <= lVar8) {
            uVar9 = pVVar4->nSize * 2;
            if ((int)uVar9 <= (int)uVar6) {
              uVar9 = uVar6;
            }
            if (pVVar4->nCap < (int)uVar9) {
              if (pVVar4->pArray == (Vec_Int_t *)0x0) {
                pVVar5 = (Vec_Int_t *)malloc((ulong)uVar9 << 4);
              }
              else {
                pVVar5 = (Vec_Int_t *)realloc(pVVar4->pArray,(ulong)uVar9 << 4);
              }
              pVVar4->pArray = pVVar5;
              memset(pVVar5 + pVVar4->nCap,0,((long)(int)uVar9 - (long)pVVar4->nCap) * 0x10);
              pVVar4->nCap = uVar9;
            }
            pVVar4->nSize = uVar6;
          }
          if (pVVar4->nSize <= lVar8) {
LAB_001f9aa4:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          Vec_IntPush(pVVar4->pArray + lVar8,Entry);
          pVVar4 = p->vFanouts2;
          if (pVVar4->nSize <= (int)Entry) {
            iVar10 = Entry + 1;
            iVar3 = pVVar4->nSize * 2;
            if (iVar3 <= iVar10) {
              iVar3 = iVar10;
            }
            if (pVVar4->nCap < iVar3) {
              __size = (long)iVar3 << 4;
              if (pVVar4->pArray == (Vec_Int_t *)0x0) {
                pVVar5 = (Vec_Int_t *)malloc(__size);
              }
              else {
                pVVar5 = (Vec_Int_t *)realloc(pVVar4->pArray,__size);
              }
              pVVar4->pArray = pVVar5;
              memset(pVVar5 + pVVar4->nCap,0,((long)iVar3 - (long)pVVar4->nCap) * 0x10);
              pVVar4->nCap = iVar3;
            }
            pVVar4->nSize = iVar10;
          }
          if (((int)Entry < 0) || (pVVar4->nSize <= (int)Entry)) goto LAB_001f9aa4;
          Vec_IntPush(pVVar4->pArray + Entry,(int)lVar8);
          lVar11 = lVar11 + 1;
          pVVar5 = p->vMapping;
          lVar12 = (long)pVVar5->nSize;
          if (lVar12 <= lVar8) goto LAB_001f9ac3;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < p->nObjs);
  }
  return;
}

Assistant:

void Edg_ManToMapping( Gia_Man_t * p )
{
    int iObj, iFanin, k;
    assert( Gia_ManHasMapping(p) );
    Vec_WecFreeP( &p->vMapping2 );
    Vec_WecFreeP( &p->vFanouts2 );
    p->vMapping2 = Vec_WecStart( Gia_ManObjNum(p) );
    p->vFanouts2 = Vec_WecStart( Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, iObj )
    {
        assert( Gia_ObjLutSize(p, iObj) <= 4 );
        Gia_LutForEachFanin( p, iObj, iFanin, k )
        {
            Vec_WecPush( p->vMapping2, iObj, iFanin );
            Vec_WecPush( p->vFanouts2, iFanin, iObj );
        }
    }
}